

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_42055d::Db::parseConversionExpr(Db *this)

{
  bool bVar1;
  char *pcVar2;
  Node **ppNVar3;
  Node **ppNVar4;
  Node *pNVar5;
  undefined8 *puVar6;
  Node *pNVar7;
  NodeArray NVar8;
  Node *E;
  Node *local_38;
  
  local_38 = (Node *)this->First;
  if ((ulong)((long)this->Last - (long)local_38) < 2) {
    return (Node *)0x0;
  }
  if (*(short *)&local_38->_vptr_Node == 0x7663) {
    this->First = (char *)((long)&local_38->_vptr_Node + 2);
    bVar1 = this->TryToParseTemplateArgs;
    this->TryToParseTemplateArgs = false;
    pNVar5 = parseType(this);
    this->TryToParseTemplateArgs = bVar1;
    if (pNVar5 != (Node *)0x0) {
      pcVar2 = this->First;
      if ((pcVar2 == this->Last) || (*pcVar2 != '_')) {
        pNVar7 = parseExpr(this);
        if (pNVar7 != (Node *)0x0) {
          puVar6 = (undefined8 *)BumpPointerAllocator::allocate(&this->ASTAllocator,8);
          *puVar6 = pNVar7;
          pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar7->K = KExpr;
          pNVar7->RHSComponentCache = No;
          pNVar7->ArrayCache = No;
          pNVar7->FunctionCache = No;
          pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eac88;
          pNVar7[1]._vptr_Node = (_func_int **)pNVar5;
          *(undefined8 **)&pNVar7[1].K = puVar6;
          pNVar7[2]._vptr_Node = (_func_int **)0x1;
          return pNVar7;
        }
      }
      else {
        this->First = pcVar2 + 1;
        ppNVar3 = (this->Names).Last;
        ppNVar4 = (this->Names).First;
        while( true ) {
          pcVar2 = this->First;
          if ((pcVar2 != this->Last) && (*pcVar2 == 'E')) {
            this->First = pcVar2 + 1;
            NVar8 = popTrailingNodeArray(this,(long)ppNVar3 - (long)ppNVar4 >> 3);
            pNVar7 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
            pNVar7->K = KExpr;
            pNVar7->RHSComponentCache = No;
            pNVar7->ArrayCache = No;
            pNVar7->FunctionCache = No;
            pNVar7->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eac88;
            pNVar7[1]._vptr_Node = (_func_int **)pNVar5;
            *(NodeArray *)&pNVar7[1].K = NVar8;
            return pNVar7;
          }
          local_38 = parseExpr(this);
          if (local_38 == (Node *)0x0) break;
          PODSmallVector<(anonymous_namespace)::Node_*,_32UL>::push_back(&this->Names,&local_38);
        }
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

bool consumeIf(StringView S) {
    if (StringView(First, Last).startsWith(S)) {
      First += S.size();
      return true;
    }
    return false;
  }